

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t uniform_hash(void *key,size_t len,uint64_t seed)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  byte *pbVar4;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t k1;
  uint8_t *tail;
  uint32_t k1_1;
  int i;
  uint32_t *blocks;
  uint32_t c2;
  uint32_t c1;
  uint32_t h1;
  int nblocks;
  uint8_t *data;
  uint local_4c;
  int local_3c;
  uint local_28;
  
  iVar1 = (int)in_ESI / 4;
  local_28 = in_EDX;
  for (local_3c = -iVar1; local_3c != 0; local_3c = local_3c + 1) {
    uVar2 = MURMUR_HASH_3::getblock((uint32_t *)(in_RDI + (iVar1 << 2)),local_3c);
    uVar2 = rotl32(uVar2 * -0x3361d2af,'\x0f');
    uVar2 = rotl32(uVar2 * 0x1b873593 ^ local_28,'\r');
    local_28 = uVar2 * 5 + 0xe6546b64;
  }
  pbVar4 = (byte *)(in_RDI + (iVar1 << 2));
  local_4c = 0;
  uVar3 = in_ESI & 3;
  if (uVar3 != 1) {
    if (uVar3 != 2) {
      if (uVar3 != 3) goto LAB_0013d30d;
      local_4c = (uint)pbVar4[2] << 0x10;
    }
    local_4c = (uint)pbVar4[1] << 8 ^ local_4c;
  }
  uVar2 = rotl32((*pbVar4 ^ local_4c) * -0x3361d2af,'\x0f');
  local_28 = uVar2 * 0x1b873593 ^ local_28;
LAB_0013d30d:
  uVar2 = MURMUR_HASH_3::fmix(local_28 ^ in_ESI);
  return (ulong)uVar2;
}

Assistant:

inline uint64_t uniform_hash(const void * key, size_t len, uint64_t seed)
{
  const uint8_t * data = (const uint8_t*)key;
  const int nblocks = (int)len / 4;

  uint32_t h1 = (uint32_t)seed;

  const uint32_t c1 = 0xcc9e2d51;
  const uint32_t c2 = 0x1b873593;

  // --- body
  const uint32_t * blocks = (const uint32_t *)(data + nblocks * 4);

  for (int i = -nblocks; i; i++)
  {
    uint32_t k1 = MURMUR_HASH_3::getblock(blocks, i);

    k1 *= c1;
    k1 = ROTL32(k1, 15);
    k1 *= c2;

    h1 ^= k1;
    h1 = ROTL32(h1, 13);
    h1 = h1 * 5 + 0xe6546b64;
  }

  // --- tail
  const uint8_t * tail = (const uint8_t*)(data + nblocks * 4);

  uint32_t k1 = 0;

  switch (len & 3)
  {
  case 3: k1 ^= tail[2] << 16;
  case 2: k1 ^= tail[1] << 8;
  case 1: k1 ^= tail[0];
    k1 *= c1; k1 = ROTL32(k1, 15); k1 *= c2; h1 ^= k1;
  }

  // --- finalization
  h1 ^= len;

  return MURMUR_HASH_3::fmix(h1);
}